

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

MPP_RET append_interview_list
                  (H264_DpbBuf_t *p_Dpb,RK_S32 currPicStructure,RK_S32 list_idx,
                  H264_FrameStore_t **list,RK_S32 *listXsize,RK_S32 currPOC,RK_S32 curr_layer_id,
                  RK_S32 anchor_pic_flag)

{
  H264_FrameStore_t *pHVar1;
  h264d_video_ctx_t *phVar2;
  RK_U32 RVar3;
  RK_U32 local_94;
  RK_U32 local_90;
  RK_U32 local_8c;
  RK_S32 *local_88;
  RK_S32 local_7c;
  RK_S32 *local_78;
  RK_S32 local_6c;
  H264dVideoCtx_t *p_Vid;
  H264_FrameStore_t *fs;
  RK_S32 iVOIdx;
  MPP_RET ret;
  RK_S32 *ref_view_id;
  uint local_40;
  RK_S32 num_ref_views;
  RK_U32 pic_avail;
  RK_S32 fld_idx;
  RK_S32 poc;
  RK_S32 currPOC_local;
  RK_S32 *listXsize_local;
  H264_FrameStore_t **list_local;
  RK_S32 list_idx_local;
  RK_S32 currPicStructure_local;
  H264_DpbBuf_t *p_Dpb_local;
  
  pic_avail = 0;
  pHVar1 = *p_Dpb->fs_ilref;
  phVar2 = p_Dpb->p_Vid;
  if (curr_layer_id < 0) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,0x3c6);
    }
    p_Dpb_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if (anchor_pic_flag == 0) {
      if (list_idx == 0) {
        local_7c = phVar2->active_subsps->num_non_anchor_refs_l0[curr_layer_id];
      }
      else {
        local_7c = phVar2->active_subsps->num_non_anchor_refs_l1[curr_layer_id];
      }
      ref_view_id._4_4_ = local_7c;
      if (list_idx == 0) {
        local_88 = phVar2->active_subsps->non_anchor_ref_l0[curr_layer_id];
      }
      else {
        local_88 = phVar2->active_subsps->non_anchor_ref_l1[curr_layer_id];
      }
      _iVOIdx = local_88;
    }
    else {
      if (list_idx == 0) {
        local_6c = phVar2->active_subsps->num_anchor_refs_l0[curr_layer_id];
      }
      else {
        local_6c = phVar2->active_subsps->num_anchor_refs_l1[curr_layer_id];
      }
      ref_view_id._4_4_ = local_6c;
      if (list_idx == 0) {
        local_78 = phVar2->active_subsps->anchor_ref_l0[curr_layer_id];
      }
      else {
        local_78 = phVar2->active_subsps->anchor_ref_l1[curr_layer_id];
      }
      _iVOIdx = local_78;
    }
    num_ref_views = (RK_S32)(currPicStructure == 2);
    if (currPicStructure == 3) {
      local_40 = (uint)(pHVar1->is_used == 3);
      if (local_40 != 0) {
        if (pHVar1->frame->is_mmco_5 == '\0') {
          local_8c = pHVar1->frame->poc;
        }
        else {
          local_8c = pHVar1->frame->poc_mmco5;
        }
        pic_avail = local_8c;
      }
    }
    else if (currPicStructure == 1) {
      local_40 = pHVar1->is_used & 1;
      if (local_40 != 0) {
        if (pHVar1->top_field->is_mmco_5 == '\0') {
          local_90 = pHVar1->top_field->poc;
        }
        else {
          local_90 = pHVar1->top_field->top_poc_mmco5;
        }
        pic_avail = local_90;
      }
    }
    else if (currPicStructure == 2) {
      local_40 = pHVar1->is_used & 2;
      if (local_40 != 0) {
        if (pHVar1->bottom_field->is_mmco_5 == '\0') {
          local_94 = pHVar1->bottom_field->poc;
        }
        else {
          local_94 = pHVar1->bottom_field->bot_poc_mmco5;
        }
        pic_avail = local_94;
      }
    }
    else {
      local_40 = 0;
    }
    if ((((local_40 != 0) && (pHVar1->inter_view_flag[num_ref_views] != 0)) &&
        (pic_avail == currPOC)) &&
       (RVar3 = is_view_id_in_ref_view_list(pHVar1->view_id,_iVOIdx,ref_view_id._4_4_), RVar3 != 0))
    {
      list[*listXsize] = pHVar1;
      *listXsize = *listXsize + 1;
    }
    p_Dpb_local._4_4_ = MPP_OK;
  }
  return p_Dpb_local._4_4_;
}

Assistant:

static MPP_RET append_interview_list(H264_DpbBuf_t *p_Dpb,
                                     RK_S32 currPicStructure, RK_S32 list_idx, H264_FrameStore_t **list,
                                     RK_S32 *listXsize, RK_S32 currPOC, RK_S32 curr_layer_id, RK_S32 anchor_pic_flag)
{
    RK_S32 poc = 0;
    RK_S32 fld_idx = 0;
    RK_U32 pic_avail = 0;
    RK_S32 num_ref_views = 0;
    RK_S32 *ref_view_id = NULL;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 iVOIdx = curr_layer_id;
    H264_FrameStore_t *fs = p_Dpb->fs_ilref[0];
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;

    VAL_CHECK(ret, iVOIdx >= 0); //!< Error: iVOIdx: %d is not less than 0
    if (anchor_pic_flag) {
        num_ref_views = list_idx ? p_Vid->active_subsps->num_anchor_refs_l1[iVOIdx] : p_Vid->active_subsps->num_anchor_refs_l0[iVOIdx];
        ref_view_id = list_idx ? p_Vid->active_subsps->anchor_ref_l1[iVOIdx] : p_Vid->active_subsps->anchor_ref_l0[iVOIdx];
    } else {
        num_ref_views = list_idx ? p_Vid->active_subsps->num_non_anchor_refs_l1[iVOIdx] : p_Vid->active_subsps->num_non_anchor_refs_l0[iVOIdx];
        ref_view_id = list_idx ? p_Vid->active_subsps->non_anchor_ref_l1[iVOIdx] : p_Vid->active_subsps->non_anchor_ref_l0[iVOIdx];
    }

    if (currPicStructure == BOTTOM_FIELD)
        fld_idx = 1;
    else
        fld_idx = 0;

    if (currPicStructure == FRAME) {
        pic_avail = (fs->is_used == 3);
        if (pic_avail) {
            poc = fs->frame->is_mmco_5 ? fs->frame->poc_mmco5 : fs->frame->poc;
        }
    } else if (currPicStructure == TOP_FIELD) {
        pic_avail = fs->is_used & 1;
        if (pic_avail) {
            poc = fs->top_field->is_mmco_5 ? fs->top_field->top_poc_mmco5 : fs->top_field->poc;
        }
    } else if (currPicStructure == BOTTOM_FIELD) {
        pic_avail = fs->is_used & 2;
        if (pic_avail) {
            poc = fs->bottom_field->is_mmco_5 ? fs->bottom_field->bot_poc_mmco5 : fs->bottom_field->poc;
        }
    } else {
        pic_avail = 0;
    }

    if (pic_avail && fs->inter_view_flag[fld_idx]) {
        if (poc == currPOC) {
            if (is_view_id_in_ref_view_list(fs->view_id, ref_view_id, num_ref_views)) {
                //!< add one inter-view reference;
                list[*listXsize] = fs;
                //!< next;
                (*listXsize)++;
            }
        }
    }
    return ret = MPP_OK;
__FAILED:
    return ret;
}